

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

bool __thiscall CLI::App::_valid_subcommand(App *this,string *current)

{
  bool bVar1;
  size_type sVar2;
  pointer this_00;
  type this_01;
  bool local_a3;
  byte local_91;
  bool local_79;
  string local_60;
  reference local_40;
  App_p *com;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range2;
  string *current_local;
  App *this_local;
  
  if ((this->require_subcommand_max_ == 0) ||
     (sVar2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&this->parsed_subcommands_)
     , sVar2 < this->require_subcommand_max_)) {
    __end2 = std::
             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ::begin(&this->subcommands_);
    com = (App_p *)std::
                   vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ::end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                       *)&com), bVar1) {
      local_40 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                 ::operator*(&__end2);
      this_00 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_40);
      ::std::__cxx11::string::string((string *)&local_60,(string *)current);
      bVar1 = check_name(this_00,&local_60);
      local_91 = 0;
      if (bVar1) {
        this_01 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator*(local_40);
        bVar1 = operator_cast_to_bool(this_01);
        local_91 = bVar1 ^ 0xff;
      }
      ::std::__cxx11::string::~string((string *)&local_60);
      if ((local_91 & 1) != 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
      ::operator++(&__end2);
    }
    local_a3 = false;
    if (this->parent_ != (App *)0x0) {
      local_a3 = _valid_subcommand(this->parent_,current);
    }
    this_local._7_1_ = local_a3;
  }
  else {
    local_79 = false;
    if (this->parent_ != (App *)0x0) {
      local_79 = _valid_subcommand(this->parent_,current);
    }
    this_local._7_1_ = local_79;
  }
  return this_local._7_1_;
}

Assistant:

bool _valid_subcommand(const std::string &current) const {
        // Don't match if max has been reached - but still check parents
        if(require_subcommand_max_ != 0 && parsed_subcommands_.size() >= require_subcommand_max_) {
            return parent_ != nullptr && parent_->_valid_subcommand(current);
        }

        for(const App_p &com : subcommands_)
            if(com->check_name(current) && !*com)
                return true;

        // Check parent if exists, else return false
        return parent_ != nullptr && parent_->_valid_subcommand(current);
    }